

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_smr(REF_DBL *metric0,REF_DBL *metric1,REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *m;
  REF_DBL *m2;
  double dVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_NODE pRVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  REF_DBL n_vectors [9];
  REF_DBL n_values [3];
  REF_DBL metric_inv [6];
  REF_DBL diagonal_system [12];
  REF_DBL inv_n_vectors [9];
  REF_DBL inv_m1_m2 [9];
  REF_DBL local_1c8;
  undefined8 local_1c0;
  double local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  REF_DBL local_178 [4];
  REF_DBL local_158 [6];
  REF_DBL local_128 [12];
  REF_DBL local_c8 [10];
  REF_DBL local_78 [9];
  
  pRVar4 = ref_grid->node;
  if (0 < pRVar4->max) {
    lVar5 = 0;
    do {
      if (-1 < pRVar4->global[lVar5]) {
        m = metric0 + lVar5 * 6;
        uVar2 = ref_matrix_inv_m(m,local_158);
        if (uVar2 == 0) {
          m2 = metric1 + lVar5 * 6;
          uVar2 = ref_matrix_mult_m(local_158,m2,local_78);
          if (uVar2 == 0) {
            uVar2 = ref_matrix_diag_gen(3,local_78,local_178,&local_1c8);
            if (uVar2 == 0) {
              pdVar10 = &local_1b8;
              lVar7 = 0;
              do {
                dVar11 = pdVar10[-2];
                dVar12 = pdVar10[-1];
                dVar13 = *pdVar10;
                dVar11 = (m[5] * dVar13 + m[2] * dVar11 + dVar12 * m[4]) * dVar13 +
                         (m[2] * dVar13 + *m * dVar11 + m[1] * dVar12) * dVar11 +
                         (m[4] * dVar13 + m[1] * dVar11 + m[3] * dVar12) * dVar12;
                if (dVar11 < 0.0) {
                  dVar11 = sqrt(dVar11);
                }
                else {
                  dVar11 = SQRT(dVar11);
                }
                dVar12 = dVar11 * 1e+20;
                if (dVar12 <= -dVar12) {
                  dVar12 = -dVar12;
                }
                if (dVar12 <= 1.0) {
                  pcVar9 = "inf h0";
                  uVar6 = 0x717;
LAB_0018064c:
                  uVar2 = 4;
                  uVar8 = 4;
                  goto LAB_00180652;
                }
                dVar12 = pdVar10[-2];
                dVar13 = pdVar10[-1];
                dVar1 = *pdVar10;
                dVar12 = (m2[5] * dVar1 + m2[2] * dVar12 + dVar13 * m2[4]) * dVar1 +
                         (m2[2] * dVar1 + *m2 * dVar12 + m2[1] * dVar13) * dVar12 +
                         (m2[4] * dVar1 + m2[1] * dVar12 + m2[3] * dVar13) * dVar13;
                if (dVar12 < 0.0) {
                  dVar12 = sqrt(dVar12);
                }
                else {
                  dVar12 = SQRT(dVar12);
                }
                dVar13 = dVar12 * 1e+20;
                if (dVar13 <= -dVar13) {
                  dVar13 = -dVar13;
                }
                if (dVar13 <= 1.0) {
                  pcVar9 = "inf h1";
                  uVar6 = 0x71a;
                  goto LAB_0018064c;
                }
                dVar13 = (1.0 / dVar11) * 4.0;
                dVar11 = (1.0 / dVar11) * 0.25;
                if (dVar11 <= 1.0 / dVar12) {
                  dVar11 = 1.0 / dVar12;
                }
                if (dVar11 <= dVar13) {
                  dVar13 = dVar11;
                }
                dVar11 = dVar13 * dVar13 * 1e+20;
                if (dVar11 <= -dVar11) {
                  dVar11 = -dVar11;
                }
                if (dVar11 <= 1.0) {
                  pcVar9 = "zero h^2";
                  uVar6 = 0x720;
                  goto LAB_0018064c;
                }
                local_128[lVar7] = 1.0 / (dVar13 * dVar13);
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 3;
              } while (lVar7 != 3);
              RVar3 = ref_matrix_inv_gen(3,&local_1c8,local_c8);
              if (RVar3 != 0) {
                puts(" unable to invert eigenvectors:");
                printf(" %f %f %f\n",local_1c8,local_1c0,local_1b8);
                printf(" %f %f %f\n",local_1b0,local_1a8,local_1a0);
                printf(" %f %f %f\n",local_198,local_190,local_188);
                pcVar9 = "gen eig";
                uVar2 = 1;
                uVar6 = 0x729;
                uVar8 = 1;
                goto LAB_00180652;
              }
              uVar2 = ref_matrix_transpose_gen(3,local_c8,local_128 + 3);
              if (uVar2 == 0) {
                uVar2 = ref_matrix_form_m(local_128,metric + lVar5 * 6);
                if (uVar2 == 0) {
                  pRVar4 = ref_grid->node;
                  goto LAB_001805bb;
                }
                pcVar9 = "reform m";
                uVar6 = 0x72d;
              }
              else {
                pcVar9 = "gen eig";
                uVar6 = 0x72c;
              }
            }
            else {
              pcVar9 = "gen eig";
              uVar6 = 0x714;
            }
          }
          else {
            pcVar9 = "mult";
            uVar6 = 0x713;
          }
        }
        else {
          pcVar9 = "inv";
          uVar6 = 0x712;
        }
        uVar8 = (ulong)uVar2;
LAB_00180652:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar6,"ref_metric_smr",uVar8,pcVar9);
        return uVar2;
      }
LAB_001805bb:
      lVar5 = lVar5 + 1;
    } while (lVar5 < pRVar4->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_smr(REF_DBL *metric0, REF_DBL *metric1,
                                  REF_DBL *metric, REF_GRID ref_grid) {
  REF_INT node;
  REF_DBL metric_inv[6];
  REF_DBL inv_m1_m2[9];
  REF_DBL n_values[3], n_vectors[9], inv_n_vectors[9];
  REF_DBL diagonal_system[12];
  REF_DBL h0, h1, h, hmax, hmin, h2;
  REF_DBL eig;
  REF_INT i;

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_inv_m(&(metric0[6 * node]), metric_inv), "inv");
    RSS(ref_matrix_mult_m(metric_inv, &(metric1[6 * node]), inv_m1_m2), "mult");
    RSS(ref_matrix_diag_gen(3, inv_m1_m2, n_values, n_vectors), "gen eig");
    for (i = 0; i < 3; i++) {
      h0 = ref_matrix_sqrt_vt_m_v(&(metric0[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h0)) RSS(REF_DIV_ZERO, "inf h0");
      h0 = 1.0 / h0;
      h1 = ref_matrix_sqrt_vt_m_v(&(metric1[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h1)) RSS(REF_DIV_ZERO, "inf h1");
      h1 = 1.0 / h1;
      hmax = 4.00 * h0;
      hmin = 0.25 * h0;
      h = MIN(hmax, MAX(hmin, h1));
      h2 = h * h;
      if (!ref_math_divisible(1.0, h2)) RSS(REF_DIV_ZERO, "zero h^2");
      eig = 1.0 / h2;
      ref_matrix_eig(diagonal_system, i) = eig;
    }
    if (REF_SUCCESS != ref_matrix_inv_gen(3, n_vectors, inv_n_vectors)) {
      printf(" unable to invert eigenvectors:\n");
      printf(" %f %f %f\n", n_vectors[0], n_vectors[1], n_vectors[2]);
      printf(" %f %f %f\n", n_vectors[3], n_vectors[4], n_vectors[5]);
      printf(" %f %f %f\n", n_vectors[6], n_vectors[7], n_vectors[8]);
      RSS(REF_FAILURE, "gen eig");
    }
    RSS(ref_matrix_transpose_gen(3, inv_n_vectors, &(diagonal_system[3])),
        "gen eig");
    RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "reform m");
  }

  return REF_SUCCESS;
}